

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O0

int __thiscall net_uv::TCPSocket::connect(TCPSocket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  char *__s;
  int iVar1;
  undefined8 extraout_RAX;
  uv_connect_t *req;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  undefined8 uVar2;
  undefined4 in_register_00000034;
  int32_t r;
  uv_connect_t *connectReq;
  uv_tcp_t *puStack_70;
  int32_t r_1;
  uv_tcp_t *tcp;
  allocator<char> local_51;
  string local_50;
  sockaddr *local_30;
  sockaddr *addr;
  uint32_t addr_len;
  uint32_t port_local;
  char *ip_local;
  TCPSocket *this_local;
  
  _addr_len = (char *)CONCAT44(in_register_00000034,__fd);
  addr._4_4_ = (uint32_t)__addr;
  addr._0_4_ = 0;
  ip_local = (char *)this;
  local_30 = net_getsocketAddr(_addr_len,addr._4_4_,(uint32_t *)&addr);
  __s = _addr_len;
  if (local_30 == (sockaddr *)0x0) {
    net_uvLog(3,"[%s:%d]Failed to get address information",_addr_len,(ulong)addr._4_4_);
    this_local._7_1_ = 0;
    uVar2 = extraout_RAX;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_51);
    Socket::setIp(&this->super_Socket,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    Socket::setPort(&this->super_Socket,addr._4_4_);
    puStack_70 = this->m_tcp;
    if (puStack_70 == (uv_tcp_t *)0x0) {
      puStack_70 = (uv_tcp_t *)malloc(0xf8);
      uv_tcp_init((this->super_Socket).m_loop,puStack_70);
      puStack_70->data = this;
    }
    req = (uv_connect_t *)malloc(0x60);
    req->data = this;
    iVar1 = uv_tcp_connect(req,puStack_70,local_30,uv_on_after_connect);
    free(local_30);
    if (iVar1 == 0) {
      setTcp(this,puStack_70);
      net_adjustBuffSize((uv_handle_t *)puStack_70,0x10000,0x10000);
      this_local._7_1_ = 1;
      uVar2 = extraout_RAX_01;
    }
    else {
      this_local._7_1_ = 0;
      uVar2 = extraout_RAX_00;
    }
  }
  return (int)CONCAT71((int7)((ulong)uVar2 >> 8),this_local._7_1_);
}

Assistant:

bool TCPSocket::connect(const char* ip, uint32_t port)
{
	uint32_t addr_len = 0;
	struct sockaddr* addr = net_getsocketAddr(ip, port, &addr_len);

	if (addr == NULL)
	{
		NET_UV_LOG(NET_UV_L_ERROR, "[%s:%d]Failed to get address information", ip, port);
		return false;
	}

	this->setIp(ip);
	this->setPort(port);

	auto tcp = m_tcp;
	if (tcp == NULL)
	{
		tcp = (uv_tcp_t*)fc_malloc(sizeof(uv_tcp_t));
		int32_t r = uv_tcp_init(m_loop, tcp);
		CHECK_UV_ASSERT(r);

		tcp->data = this;
	}
	
	uv_connect_t* connectReq = (uv_connect_t*)fc_malloc(sizeof(uv_connect_t));
	connectReq->data = this;
	int32_t r = uv_tcp_connect(connectReq, tcp, addr, uv_on_after_connect);
	fc_free(addr);
	if (r)
	{
		return false;
	}
	setTcp(tcp);
	net_adjustBuffSize((uv_handle_t*)tcp, TCP_UV_SOCKET_RECV_BUF_LEN, TCP_UV_SOCKET_SEND_BUF_LEN);
	return true;
}